

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

void __thiscall
TxRequestTracker::Impl::SetTimePoint
          (Impl *this,microseconds now,
          vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *expired)

{
  type *this_00;
  unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
  *this_01;
  key_type *__x;
  size_type *psVar1;
  long *plVar2;
  pointer ppVar3;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar4;
  pointer poVar5;
  ulong uVar6;
  undefined8 uVar7;
  Iter<ByTxHash> it;
  bool bVar8;
  iterator iVar9;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  x;
  _Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false> _Var10;
  Priority PVar11;
  Priority PVar12;
  size_type sVar13;
  long *plVar14;
  long lVar15;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  it_00;
  long in_FS_OFFSET;
  GenTxid local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((expired !=
       (vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *)0x0) &&
     (ppVar3 = (expired->
               super__Vector_base<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (expired->
     super__Vector_base<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>).
     _M_impl.super__Vector_impl_data._M_finish != ppVar3)) {
    (expired->
    super__Vector_base<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  this_00 = &(this->m_index).super_type;
  this_01 = &this->m_peerinfo;
LAB_008b2214:
  do {
    sVar13 = (this->m_index).node_count;
    if (sVar13 == 0) break;
    poVar4 = (this->m_index).
             super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
             .member;
    poVar5 = (poVar4->
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
             ).
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
             .
             super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
             .
             super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .
             super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .super_type.left_;
    it_00.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                  *)&poVar5[-3].
                     super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                     .super_type.right_;
    if (poVar5 == (pointer)0x0) {
      it_00.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                    *)0x0;
    }
    uVar6 = *(ulong *)((long)&((it_00.node)->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              ).
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_ + 0x30);
    if (uVar6 >> 0x3d != 3) {
      if (((uint)(uVar6 >> 0x3d) != 0) ||
         (now.__r < *(long *)((long)&((it_00.node)->
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                     ).
                                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                     space.data_ + 0x20))) {
LAB_008b25fc:
        sVar13 = 1;
        break;
      }
      if (poVar4 == (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                     *)it_00.node) {
        __assert_fail("it != m_index.get<ByTxHash>().end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                      ,0x193,"void TxRequestTracker::Impl::PromoteCandidateReady(Iter<ByTxHash>)");
      }
      if (0x1fffffffffffffff < uVar6) {
        __assert_fail("it->GetState() == State::CANDIDATE_DELAYED",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                      ,0x194,"void TxRequestTracker::Impl::PromoteCandidateReady(Iter<ByTxHash>)");
      }
      __x = (key_type *)
            (((it_00.node)->
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
             ).
             super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
             .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf + 0x28);
      iVar9 = std::
              unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
              ::find(this_01,__x);
      *(ulong *)((long)&((it_00.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                0x30) = uVar6 + 0x2000000000000000;
      bVar8 = boost::multi_index::detail::
              ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
              ::modify_(&this_00->super_type,(index_node_type *)it_00.node);
      if (!bVar8) {
        operator_delete(it_00.node,0x80);
        psVar1 = &(this->m_index).node_count;
        *psVar1 = *psVar1 - 1;
      }
      *(long *)((long)iVar9.
                      super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                      ._M_cur + 0x18) =
           *(long *)((long)iVar9.
                           super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ._M_cur + 0x18) +
           (ulong)((*(ulong *)((long)&((it_00.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x8000000000000000);
      *(long *)((long)iVar9.
                      super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                      ._M_cur + 0x20) =
           *(long *)((long)iVar9.
                           super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                           ._M_cur + 0x20) +
           (ulong)((*(ulong *)((long)&((it_00.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x6000000000000000);
      x = std::
          next<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,std::allocator<(anonymous_namespace)::Announcement>>>>>>
                    (it_00,-0x8000000000000000);
      if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)x.node ==
          (this->m_index).
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
          .member) {
LAB_008b2338:
        _Var10._M_cur =
             (__node_type *)
             std::
             unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
             ::find(this_01,__x);
        *(long *)((long)_Var10._M_cur + 0x18) =
             *(long *)((long)_Var10._M_cur + 0x18) -
             (ulong)((*(ulong *)((long)&((it_00.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x8000000000000000);
        *(long *)((long)_Var10._M_cur + 0x20) =
             *(long *)((long)_Var10._M_cur + 0x20) -
             (ulong)((*(ulong *)((long)&((it_00.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        *(ulong *)((long)&((it_00.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) =
             *(ulong *)((long)&((it_00.node)->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               ).
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_ + 0x30) & 0x1fffffffffffffff | 0x4000000000000000;
        bVar8 = boost::multi_index::detail::
                ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::modify_(&this_00->super_type,(index_node_type *)it_00.node);
      }
      else {
        bVar8 = ::operator!=((base_blob<256U> *)x.node,(base_blob<256U> *)it_00.node);
        if (bVar8) goto LAB_008b2338;
        uVar6 = *(ulong *)((long)&((x.node)->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                  ).
                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space
                                  .data_ + 0x30);
        if (uVar6 >> 0x3d != 2) {
          if ((uint)(uVar6 >> 0x3d) == 4) goto LAB_008b2338;
          goto LAB_008b2214;
        }
        PVar11 = anon_unknown.dwarf_2c9a745::PriorityComputer::operator()
                           (&this->m_computer,(Announcement *)x.node);
        PVar12 = anon_unknown.dwarf_2c9a745::PriorityComputer::operator()
                           (&this->m_computer,(Announcement *)it_00.node);
        if (PVar12 <= PVar11) goto LAB_008b2214;
        iVar9 = std::
                unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                ::find(this_01,(key_type *)
                               (((x.node)->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                ).
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_.buf + 0x28));
        *(long *)((long)iVar9.
                        super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                        ._M_cur + 0x18) =
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ._M_cur + 0x18) -
             (ulong)((*(ulong *)((long)&((x.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x8000000000000000);
        *(long *)((long)iVar9.
                        super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                        ._M_cur + 0x20) =
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ._M_cur + 0x20) -
             (ulong)((*(ulong *)((long)&((x.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        *(ulong *)((long)&((x.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) =
             (*(ulong *)((long)&((x.node)->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                ).
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 0x30) & 0x1fffffffffffffff) + 0x2000000000000000;
        bVar8 = boost::multi_index::detail::
                ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::modify_(&this_00->super_type,(index_node_type *)x.node);
        if (!bVar8) {
          operator_delete(x.node,0x80);
          psVar1 = &(this->m_index).node_count;
          *psVar1 = *psVar1 - 1;
        }
        *(long *)((long)iVar9.
                        super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                        ._M_cur + 0x18) =
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ._M_cur + 0x18) +
             (ulong)((*(ulong *)((long)&((x.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x8000000000000000);
        *(long *)((long)iVar9.
                        super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                        ._M_cur + 0x20) =
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ._M_cur + 0x20) +
             (ulong)((*(ulong *)((long)&((x.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        _Var10._M_cur =
             (__node_type *)
             std::
             unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
             ::find(this_01,__x);
        *(long *)((long)_Var10._M_cur + 0x18) =
             *(long *)((long)_Var10._M_cur + 0x18) -
             (ulong)((*(ulong *)((long)&((it_00.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x8000000000000000);
        *(long *)((long)_Var10._M_cur + 0x20) =
             *(long *)((long)_Var10._M_cur + 0x20) -
             (ulong)((*(ulong *)((long)&((it_00.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        *(ulong *)((long)&((it_00.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) =
             *(ulong *)((long)&((it_00.node)->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               ).
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_ + 0x30) & 0x1fffffffffffffff | 0x4000000000000000;
        bVar8 = boost::multi_index::detail::
                ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::modify_(&this_00->super_type,(index_node_type *)it_00.node);
      }
      plVar2 = (long *)((long)&((_Var10._M_cur)->
                               super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                               ._M_storage._M_storage + 0x10);
      plVar14 = (long *)((long)&((_Var10._M_cur)->
                                super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                                ._M_storage._M_storage + 0x18);
      if (bVar8 == false) {
        operator_delete(it_00.node,0x80);
        psVar1 = &(this->m_index).node_count;
        *psVar1 = *psVar1 - 1;
      }
      *plVar2 = *plVar2 + (ulong)((*(ulong *)((long)&((it_00.node)->
                                                                                                          
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) & 0xe000000000000000) ==
                                 0x8000000000000000);
      *plVar14 = *plVar14 +
                 (ulong)((*(ulong *)((long)&((it_00.node)->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            ).
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x6000000000000000);
      goto LAB_008b2214;
    }
    if (now.__r < *(long *)((long)&((it_00.node)->
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                   ).
                                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                   space.data_ + 0x20)) goto LAB_008b25fc;
    if (expired !=
        (vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *)0x0) {
      uVar7 = *(undefined8 *)
               &((it_00.node)->
                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                ).
                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_;
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            ((long)&((it_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 8);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)&((it_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 0x10)
      ;
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)&((it_00.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    ).
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 0x18)
      ;
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ = SUB87(uVar7,0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)uVar7 >> 0x38);
      local_60.m_is_wtxid = (bool)((byte)(uVar6 >> 0x3c) & 1);
      std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>::
      emplace_back<long_const&,GenTxid>
                ((vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>> *)expired,
                 (long *)(((it_00.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf + 0x28),&local_60);
    }
    MakeCompleted(this,(Iter<ByTxHash>)it_00.node);
  } while( true );
  while (sVar13 != 0) {
    poVar4 = (this->m_index).
             super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
             .member;
    local_60.m_is_wtxid = SUB81(poVar4,0);
    local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ = SUB87((ulong)poVar4 >> 8,0);
    lVar15 = 1;
    while (bVar8 = lVar15 != 0, lVar15 = lVar15 + -1, bVar8) {
      boost::multi_index::detail::
      ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
      ::decrement((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   **)&local_60);
    }
    it.node._1_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0];
    it.node._2_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[1];
    it.node._3_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[2];
    it.node._4_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[3];
    it.node._5_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[4];
    it.node._6_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[5];
    it.node._7_1_ = local_60.m_hash.super_base_blob<256U>.m_data._M_elems[6];
    it.node._0_1_ = local_60.m_is_wtxid;
    if ((1 < (*(ulong *)((long)&((it.node)->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                ).
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 0x30) >> 0x3d) - 1) ||
       (*(long *)((long)&((it.node)->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         ).
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                 0x20) <= now.__r)) break;
    ChangeAndReselect(this,it,CANDIDATE_DELAYED);
    sVar13 = (this->m_index).node_count;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetTimePoint(std::chrono::microseconds now, std::vector<std::pair<NodeId, GenTxid>>* expired)
    {
        if (expired) expired->clear();

        // Iterate over all CANDIDATE_DELAYED and REQUESTED from old to new, as long as they're in the past,
        // and convert them to CANDIDATE_READY and COMPLETED respectively.
        while (!m_index.empty()) {
            auto it = m_index.get<ByTime>().begin();
            if (it->GetState() == State::CANDIDATE_DELAYED && it->m_time <= now) {
                PromoteCandidateReady(m_index.project<ByTxHash>(it));
            } else if (it->GetState() == State::REQUESTED && it->m_time <= now) {
                if (expired) expired->emplace_back(it->m_peer, ToGenTxid(*it));
                MakeCompleted(m_index.project<ByTxHash>(it));
            } else {
                break;
            }
        }

        while (!m_index.empty()) {
            // If time went backwards, we may need to demote CANDIDATE_BEST and CANDIDATE_READY announcements back
            // to CANDIDATE_DELAYED. This is an unusual edge case, and unlikely to matter in production. However,
            // it makes it much easier to specify and test TxRequestTracker::Impl's behaviour.
            auto it = std::prev(m_index.get<ByTime>().end());
            if (it->IsSelectable() && it->m_time > now) {
                ChangeAndReselect(m_index.project<ByTxHash>(it), State::CANDIDATE_DELAYED);
            } else {
                break;
            }
        }
    }